

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void recognize_face(Mat *face,Net *net,vector<float,_std::allocator<float>_> *fv)

{
  float *__x;
  int local_214;
  Mat local_210 [4];
  int i;
  Mat vec;
  int local_204;
  string local_1b0 [32];
  string local_190 [8];
  Mat probMat;
  Scalar_<double> local_130;
  allocator local_109;
  string local_108 [32];
  _InputArray local_e8;
  Scalar_<double> local_d0;
  Size_<int> local_a0;
  _InputArray local_98;
  undefined1 local_80 [8];
  Mat blob;
  vector<float,_std::allocator<float>_> *fv_local;
  Net *net_local;
  Mat *face_local;
  
  cv::_InputArray::_InputArray(&local_98,face);
  cv::Size_<int>::Size_(&local_a0,0x60,0x60);
  cv::Scalar_<double>::Scalar_(&local_d0,0.0,0.0,0.0,0.0);
  cv::dnn::dnn4_v20211004::blobFromImage
            ((_InputArray *)local_80,0.00392156862745098,(Size_ *)&local_98,(Scalar_ *)&local_a0,
             SUB81(&local_d0,0),true,0);
  cv::_InputArray::~_InputArray(&local_98);
  cv::_InputArray::_InputArray(&local_e8,(Mat *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"",&local_109);
  cv::Scalar_<double>::Scalar_(&local_130);
  cv::dnn::dnn4_v20211004::Net::setInput
            ((_InputArray *)net,(string *)&local_e8,1.0,(Scalar_ *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  cv::_InputArray::~_InputArray(&local_e8);
  std::__cxx11::string::string(local_1b0);
  cv::dnn::dnn4_v20211004::Net::forward(local_190);
  std::__cxx11::string::~string(local_1b0);
  cv::Mat::reshape((int)local_210,(int)local_190);
  for (local_214 = 0; local_214 < local_204; local_214 = local_214 + 1) {
    __x = cv::Mat::at<float>(local_210,0,local_214);
    std::vector<float,_std::allocator<float>_>::push_back(fv,__x);
  }
  cv::Mat::~Mat(local_210);
  cv::Mat::~Mat((Mat *)local_190);
  cv::Mat::~Mat((Mat *)local_80);
  return;
}

Assistant:

void recognize_face(Mat& face, Net net, vector<float> &fv){
    Mat blob = blobFromImage(face, 1/255.0, Size(96, 96),
            Scalar(0, 0, 0), true, false);
    net.setInput(blob);
    Mat probMat = net.forward();
    Mat vec = probMat.reshape(1, 1);

    for(int i = 0; i < vec.cols; i++){
        fv.push_back(vec.at<float>(0, i));
    }
}